

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::commandProcessStarted
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr
  *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = (this->cAPIDelegate).command_process_started;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr *)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,
               (llb_buildsystem_process_t *)handle.id);
    return;
  }
  return;
}

Assistant:

virtual void commandProcessStarted(Command* command,
                                     ProcessHandle handle) override {
    if (cAPIDelegate.command_process_started) {
      cAPIDelegate.command_process_started(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          (llb_buildsystem_process_t*) handle.id);
    }
  }